

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  _Alloc_hider __ptr;
  glyph g;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  undefined1 local_400 [608];
  stringstream local_1a0 [128];
  ios_base local_120 [272];
  
  if (argc == 3) {
    font2svg::glyph::glyph((glyph *)local_400,argv[1],argv[2]);
    font2svg::glyph::svgheader_abi_cxx11_(&local_420,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_420._M_dataplus._M_p,local_420._M_string_length)
    ;
    font2svg::glyph::svgborder_abi_cxx11_(&local_440,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_440._M_dataplus._M_p,local_440._M_string_length);
    font2svg::glyph::svgtransform_abi_cxx11_(&local_460,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_460._M_dataplus._M_p,local_460._M_string_length);
    font2svg::glyph::axes_abi_cxx11_(&local_480,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_480._M_dataplus._M_p,local_480._M_string_length);
    font2svg::glyph::typography_box_abi_cxx11_(&local_4a0,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_4a0._M_dataplus._M_p,local_4a0._M_string_length);
    font2svg::glyph::points_abi_cxx11_(&local_4c0,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
    font2svg::glyph::pointlines_abi_cxx11_(&local_4e0,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_4e0._M_dataplus._M_p,local_4e0._M_string_length);
    font2svg::glyph::outline_abi_cxx11_(&local_500,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_500._M_dataplus._M_p,local_500._M_string_length);
    font2svg::glyph::labelpts_abi_cxx11_(&local_520,(glyph *)local_400);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_520._M_dataplus._M_p,local_520._M_string_length);
    font2svg::glyph::svgfooter_abi_cxx11_(&local_540,(glyph *)local_400);
    __ptr._M_p = local_540._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_540._M_dataplus._M_p,local_540._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      __ptr._M_p = (pointer)(local_540.field_2._M_allocated_capacity + 1);
      operator_delete(local_540._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      __ptr._M_p = (pointer)(local_520.field_2._M_allocated_capacity + 1);
      operator_delete(local_520._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      __ptr._M_p = (pointer)(local_500.field_2._M_allocated_capacity + 1);
      operator_delete(local_500._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      __ptr._M_p = (pointer)(local_4e0.field_2._M_allocated_capacity + 1);
      operator_delete(local_4e0._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      __ptr._M_p = (pointer)(local_4c0.field_2._M_allocated_capacity + 1);
      operator_delete(local_4c0._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      __ptr._M_p = (pointer)(local_4a0.field_2._M_allocated_capacity + 1);
      operator_delete(local_4a0._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      __ptr._M_p = (pointer)(local_480.field_2._M_allocated_capacity + 1);
      operator_delete(local_480._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      __ptr._M_p = (pointer)(local_460.field_2._M_allocated_capacity + 1);
      operator_delete(local_460._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      __ptr._M_p = (pointer)(local_440.field_2._M_allocated_capacity + 1);
      operator_delete(local_440._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      __ptr._M_p = (pointer)(local_420.field_2._M_allocated_capacity + 1);
      operator_delete(local_420._M_dataplus._M_p,(ulong)__ptr._M_p);
    }
    font2svg::ttf_file::free((ttf_file *)(local_400 + 0x88),__ptr._M_p);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_400 + 0xd8));
    std::ios_base::~ios_base((ios_base *)(local_400 + 0x158));
    if ((undefined1 *)local_400._136_8_ != local_400 + 0x98) {
      operator_delete((void *)local_400._136_8_,local_400._152_8_ + 1);
    }
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  std::operator<<(poVar1," file.ttf 0x0042\n");
  exit(1);
}

Assistant:

int main( int argc, char * argv[] )
{
	if (argc!=3) {
		std::cerr << "usage: " << argv[0] << " file.ttf 0x0042\n";
		exit( 1 );
	}

	font2svg::glyph g( argv[1], argv[2] );
	std::cout << g.svgheader()
		<< g.svgborder()
		<< g.svgtransform()
		<< g.axes()
		<< g.typography_box()
		<< g.points()
		<< g.pointlines()
		<< g.outline()
		<< g.labelpts()
		<< g.svgfooter();

	g.free();

  return 0;
}